

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O0

bool __thiscall
iDynTree::SensorsList::setSerialization
          (SensorsList *this,SensorType *sensor_type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *serializaton)

{
  size_type sVar1;
  size_t sVar2;
  ostream *poVar3;
  ptrdiff_t pVar4;
  const_reference pvVar5;
  reference ppSVar6;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *in_RDX;
  uint *in_RSI;
  long in_RDI;
  ptrdiff_t oldSensIndex;
  size_t i;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> newVecSensors;
  SensorType *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  SensorType *in_stack_ffffffffffffff48;
  SensorsList *in_stack_ffffffffffffff50;
  SensorsList *in_stack_ffffffffffffff58;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *in_stack_ffffffffffffff60;
  ulong local_58;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *in_stack_ffffffffffffffd8;
  bool local_1;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RDX);
  sVar2 = getNrOfSensors((SensorsList *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (sVar1 == sVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RDX);
    std::allocator<iDynTree::Sensor_*>::allocator((allocator<iDynTree::Sensor_*> *)0x474fe0);
    std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::vector
              (in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58,
               (allocator_type *)in_stack_ffffffffffffff50);
    std::allocator<iDynTree::Sensor_*>::~allocator((allocator<iDynTree::Sensor_*> *)0x475006);
    local_58 = 0;
    while( true ) {
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_RDX);
      if (sVar1 <= local_58) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDX,local_58);
      pVar4 = getSensorIndex(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                             in_stack_ffffffffffffff40);
      if (pVar4 == -1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "[ERROR] SensorsTree::setSerialization error : sensor ");
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_RDX,local_58);
        in_stack_ffffffffffffff50 = (SensorsList *)std::operator<<(poVar3,(string *)pvVar5);
        poVar3 = std::operator<<((ostream *)in_stack_ffffffffffffff50," not found in sensor list.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        local_1 = false;
        goto LAB_004751d2;
      }
      in_stack_ffffffffffffff40 =
           (string *)
           getSensor(in_stack_ffffffffffffff58,(SensorType *)in_stack_ffffffffffffff50,
                     (ptrdiff_t)in_stack_ffffffffffffff48);
      ppSVar6 = std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::operator[]
                          ((vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *)
                           &stack0xffffffffffffffc8,local_58);
      *ppSVar6 = (value_type)in_stack_ffffffffffffff40;
      local_58 = local_58 + 1;
    }
    std::
    vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
    ::operator[](*(vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                   **)(in_RDI + 8),(ulong)*in_RSI);
    std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::operator=
              (in_RDX,in_stack_ffffffffffffffd8);
    local_1 = true;
LAB_004751d2:
    std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::~vector
              ((vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *)
               in_stack_ffffffffffffff50);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "[ERROR] SensorsTree::setSerialization error : wrong size of serializaton vector"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SensorsList::setSerialization(const SensorType& sensor_type,
                                   const std::vector< std::string >& serializaton)
{
    if( serializaton.size() != this->getNrOfSensors(sensor_type) )
    {
         std::cerr << "[ERROR] SensorsTree::setSerialization error : wrong size of serializaton vector" << std::endl;
         return false;
    }

    std::vector<Sensor *> newVecSensors(serializaton.size());

    for(size_t i=0; i < serializaton.size(); i++ )
    {
        std::ptrdiff_t oldSensIndex = getSensorIndex(sensor_type,serializaton[i]);
        if( oldSensIndex == -1 )
        {
            std::cerr << "[ERROR] SensorsTree::setSerialization error : sensor " << serializaton[i] << " not found in sensor list." << std::endl;
            return false;
        }
        newVecSensors[i] = this->getSensor(sensor_type,oldSensIndex);
    }

    this->pimpl->allSensors[sensor_type] = newVecSensors;

    return true;
}